

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# second_order_all_pass_mel_cepstral_analysis.cc
# Opt level: O0

bool anon_unknown.dwarf_ce86::CoefficientsFrequencyTransform
               (vector<double,_std::allocator<double>_> *input,int input_length,int output_length,
               int fft_length,double alpha,double theta,
               vector<double,_std::allocator<double>_> *output,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result_00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last1;
  bool bVar1;
  size_type sVar2;
  double dVar3;
  double omega;
  reference pvVar4;
  reference pvVar5;
  value_type vVar6;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<double,_std::allocator<double>_> *in_R8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R9;
  double in_XMM0_Qa;
  double dVar7;
  double in_XMM1_Qa;
  int m2_1;
  int m1;
  int m2;
  int j_2;
  int j_1;
  int m;
  InverseFastFourierTransform inverse_fourier_transform;
  int j;
  double delta;
  vector<double,_std::allocator<double>_> ww;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  imag;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffda8;
  InverseFastFourierTransform *in_stack_fffffffffffffdb0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdb8;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdd0;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffdd8;
  undefined1 *theta_00;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_198;
  int local_194;
  int local_154;
  vector<double,_std::allocator<double>_> local_140;
  undefined1 local_122 [26];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_108 [3];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_c0;
  double *local_a0;
  double *local_98;
  double *local_90;
  double *local_88;
  undefined8 local_80;
  double *local_78;
  double *local_70;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  double local_30;
  double local_28;
  int local_1c;
  int local_18;
  int local_14;
  byte local_1;
  
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_R8);
  if (sVar2 != (long)local_18) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  }
  if ((((local_28 != 0.0) || (NAN(local_28))) || (local_30 != 0.0)) || (NAN(local_30))) {
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(local_40);
    if (sVar2 != (long)local_18) {
      std::allocator<double>::allocator((allocator<double> *)0x10ae10);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
                 CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 (allocator_type *)in_stack_fffffffffffffdc0._M_current);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10ae41);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffdd0._M_current,
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               (value_type *)in_stack_fffffffffffffdc0._M_current,
               (allocator_type *)in_stack_fffffffffffffdb8._M_current);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10ae6f);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_current);
      std::allocator<double>::~allocator((allocator<double> *)0x10ae89);
      dVar3 = (double)(long)local_18;
      omega = (double)(long)local_1c;
      std::allocator<double>::allocator((allocator<double> *)0x10aeb5);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
                 CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 (allocator_type *)in_stack_fffffffffffffdc0._M_current);
      theta_00 = local_122;
      std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10aee0);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffffdd0._M_current,
               CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
               (value_type *)in_stack_fffffffffffffdc0._M_current,
               (allocator_type *)in_stack_fffffffffffffdb8._M_current);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator
                ((allocator<std::vector<double,_std::allocator<double>_>_> *)0x10af0e);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_current);
      std::allocator<double>::~allocator((allocator<double> *)0x10af28);
      std::allocator<double>::allocator((allocator<double> *)0x10af47);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current,
                 CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 (allocator_type *)in_stack_fffffffffffffdc0._M_current);
      std::allocator<double>::~allocator((allocator<double> *)0x10af6d);
      for (local_154 = 0; local_154 < local_1c; local_154 = local_154 + 1) {
        dVar7 = sptk::Warp(omega,dVar3,(double)theta_00);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_140,(long)local_154);
        *pvVar4 = dVar7;
      }
      sptk::InverseFastFourierTransform::InverseFastFourierTransform
                (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      for (local_194 = 0; local_194 < local_18; local_194 = local_194 + 1) {
        for (local_198 = 0; local_198 < local_1c; local_198 = local_198 + 1) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_140,(long)local_198);
          in_stack_fffffffffffffdd0._M_current = (double *)cos(*pvVar4 * (double)local_194);
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_c0,(long)local_194);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_198);
          *pvVar4 = (value_type)in_stack_fffffffffffffdd0._M_current;
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_140,(long)local_198);
          dVar3 = sin(*pvVar4 * (double)local_194);
          vVar6 = -dVar3;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](local_108,(long)local_194);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_198);
          *pvVar4 = vVar6;
        }
        in_stack_fffffffffffffdc0._M_current =
             (double *)
             std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&local_c0,(long)local_194);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](local_108,(long)local_194);
        in_stack_fffffffffffffdcf =
             sptk::InverseFastFourierTransform::Run
                       ((InverseFastFourierTransform *)in_stack_fffffffffffffdb8._M_current,
                        (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffda8);
        if (!(bool)in_stack_fffffffffffffdcf) {
          local_1 = 0;
          bVar1 = true;
          goto LAB_0010b392;
        }
        for (local_1a0 = 1; local_1a0 < local_14; local_1a0 = local_1a0 + 1) {
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_c0,(long)local_194);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (pvVar5,(long)(local_1c - local_1a0));
          in_stack_fffffffffffffdb8._M_current = (double *)*pvVar4;
          pvVar5 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::operator[](&local_c0,(long)local_194);
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](pvVar5,(long)local_1a0);
          *pvVar4 = (double)in_stack_fffffffffffffdb8._M_current + *pvVar4;
        }
      }
      bVar1 = false;
LAB_0010b392:
      sptk::InverseFastFourierTransform::~InverseFastFourierTransform
                ((InverseFastFourierTransform *)0x10b39f);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdc0._M_current);
      if (!bVar1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffffdd0._M_current,
                 CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
        for (local_1a4 = 0; local_1a4 < local_18; local_1a4 = local_1a4 + 1) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::operator[](local_40,(long)local_1a4);
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffdd0._M_current
                     ,CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
          for (local_1a8 = 0; local_1a8 < local_14; local_1a8 = local_1a8 + 1) {
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](&local_c0,(long)local_1a4);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)local_1a8);
            vVar6 = *pvVar4;
            pvVar5 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::operator[](local_40,(long)local_1a4);
            pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                               (pvVar5,(long)local_1a8);
            *pvVar4 = vVar6;
          }
        }
        bVar1 = false;
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffdc0._M_current);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffdc0._M_current);
      if (bVar1) goto LAB_0010b621;
    }
    for (local_1ac = 0; local_1ac < local_18; local_1ac = local_1ac + 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](local_40,(long)local_1ac);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator[](local_40,(long)local_1ac);
      std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffda8);
      std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      __last1._M_current._7_1_ = in_stack_fffffffffffffdcf;
      __last1._M_current._0_7_ = in_stack_fffffffffffffdc8;
      in_stack_fffffffffffffda8 =
           (vector<double,_std::allocator<double>_> *)
           std::
           inner_product<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>
                     (in_stack_fffffffffffffdd0,__last1,in_stack_fffffffffffffdc0,
                      (double)in_stack_fffffffffffffdb8._M_current);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_38,(long)local_1ac);
      *pvVar4 = (value_type)in_stack_fffffffffffffda8;
    }
    local_1 = 1;
  }
  else {
    if (local_14 < local_18) {
      local_48 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      local_50 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffda8);
      local_58 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      __result._M_current._7_1_ = in_stack_fffffffffffffdcf;
      __result._M_current._0_7_ = in_stack_fffffffffffffdc8;
      local_60 = (double *)
                 std::
                 copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                           (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0._M_current,__result)
      ;
      local_70 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      local_68 = (double *)
                 __gnu_cxx::
                 __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+(in_stack_fffffffffffffdb8._M_current,
                           (difference_type)in_stack_fffffffffffffdb0);
      local_78 = (double *)
                 std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffda8);
      local_80 = 0;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_stack_fffffffffffffdc0._M_current,in_stack_fffffffffffffdb8,
                 (double *)in_stack_fffffffffffffdb0);
    }
    else {
      local_88 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      local_98 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      local_90 = (double *)
                 __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator+(in_stack_fffffffffffffdb8._M_current,
                           (difference_type)in_stack_fffffffffffffdb0);
      local_a0 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffda8);
      __result_00._M_current._7_1_ = in_stack_fffffffffffffdcf;
      __result_00._M_current._0_7_ = in_stack_fffffffffffffdc8;
      std::
      copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (in_stack_fffffffffffffdd8,
                 (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
                 in_stack_fffffffffffffdd0._M_current,__result_00);
    }
    local_1 = 1;
  }
LAB_0010b621:
  return (bool)(local_1 & 1);
}

Assistant:

bool CoefficientsFrequencyTransform(const std::vector<double>& input,
                                    int input_length, int output_length,
                                    int fft_length, double alpha, double theta,
                                    std::vector<double>* output,
                                    std::vector<std::vector<double> >* buffer) {
  if (output->size() != static_cast<std::size_t>(output_length)) {
    output->resize(output_length);
  }

  if (0.0 == alpha && 0.0 == theta) {
    if (input_length < output_length) {
      std::copy(input.begin(), input.end(), output->begin());
      std::fill(output->begin() + input_length, output->end(), 0.0);
    } else {
      std::copy(input.begin(), input.begin() + output_length, output->begin());
    }
    return true;
  }

  if (buffer->size() != static_cast<std::size_t>(output_length)) {
    std::vector<std::vector<double> > real(output_length,
                                           std::vector<double>(fft_length));
    std::vector<std::vector<double> > imag(output_length,
                                           std::vector<double>(fft_length));
    {
      std::vector<double> ww(fft_length);
      {
        const double delta(sptk::kTwoPi / fft_length);
        for (int j(0); j < fft_length; ++j) {
          ww[j] = sptk::Warp(delta * j, alpha, theta);
        }
      }

      sptk::InverseFastFourierTransform inverse_fourier_transform(fft_length);
      for (int m(0); m < output_length; ++m) {
        for (int j(0); j < fft_length; ++j) {
          real[m][j] = std::cos(ww[j] * m);
          imag[m][j] = -std::sin(ww[j] * m);
        }

        if (!inverse_fourier_transform.Run(&real[m], &imag[m])) {
          return false;
        }

        for (int j(1); j < input_length; ++j) {
          real[m][j] += real[m][fft_length - j];
        }
      }
    }

    buffer->resize(output_length);
    for (int m2(0); m2 < output_length; ++m2) {
      (*buffer)[m2].resize(input_length);
      for (int m1(0); m1 < input_length; ++m1) {
        (*buffer)[m2][m1] = real[m2][m1];
      }
    }
  }

  for (int m2(0); m2 < output_length; ++m2) {
    (*output)[m2] = std::inner_product((*buffer)[m2].begin(),
                                       (*buffer)[m2].end(), input.begin(), 0.0);
  }

  return true;
}